

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.h
# Opt level: O0

uint __thiscall crnlib::dxt5_block::get_selector(dxt5_block *this,uint x,uint y)

{
  uint uVar1;
  uint uVar2;
  uint local_2c;
  uint v;
  uint bit_ofs;
  uint byte_index;
  uint bit_index;
  uint selector_index;
  uint y_local;
  uint x_local;
  dxt5_block *this_local;
  
  uVar1 = (y * 4 + x) * 3;
  uVar2 = uVar1 >> 3;
  local_2c = (uint)this->m_selectors[uVar2];
  if (uVar2 < 5) {
    local_2c = (uint)CONCAT11(this->m_selectors[uVar2 + 1],this->m_selectors[uVar2]);
  }
  return local_2c >> ((byte)uVar1 & 7) & 7;
}

Assistant:

inline uint get_selector(uint x, uint y) const
        {
            CRNLIB_ASSERT((x < 4U) && (y < 4U));

            uint selector_index = (y * 4) + x;
            uint bit_index = selector_index * cDXT5SelectorBits;

            uint byte_index = bit_index >> 3;
            uint bit_ofs = bit_index & 7;

            uint v = m_selectors[byte_index];
            if (byte_index < (cNumSelectorBytes - 1))
            {
                v |= (m_selectors[byte_index + 1] << 8);
            }

            return (v >> bit_ofs) & 7;
        }